

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itersolv.c
# Opt level: O0

Vector * GMRESIter(QMatrix *A,Vector *x,Vector *b,int MaxIter,PrecondProcType PrecondProc,
                  double OmegaPrecond)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  LASErrIdType LVar5;
  Boolean BVar6;
  int iVar7;
  void *__ptr;
  void *pvVar8;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  size_t Dim_00;
  void *__ptr_03;
  Vector *pVVar9;
  double bNorm_00;
  double dVar10;
  undefined1 auVar11 [16];
  bool local_c9;
  Vector *v;
  Boolean AllocOK;
  size_t Dim;
  double *c2;
  double *c1;
  double *s;
  double *y;
  double **h;
  double bNorm;
  double r;
  double h2;
  double h1;
  int local_50;
  int k;
  int j;
  int i;
  int Iter;
  char vName [10];
  double OmegaPrecond_local;
  PrecondProcType PrecondProc_local;
  int MaxIter_local;
  Vector *b_local;
  Vector *x_local;
  QMatrix *A_local;
  
  vName._2_8_ = OmegaPrecond;
  Q_Lock(A);
  V_Lock(x);
  V_Lock(b);
  bVar4 = true;
  __ptr = malloc((long)(GMRESSteps + 1) << 3);
  if (__ptr == (void *)0x0) {
    bVar4 = false;
  }
  else {
    for (k = 1; k <= GMRESSteps; k = k + 1) {
      pvVar8 = malloc((long)(GMRESSteps + 2) << 3);
      *(void **)((long)__ptr + (long)k * 8) = pvVar8;
      if (*(long *)((long)__ptr + (long)k * 8) == 0) {
        bVar4 = false;
      }
    }
  }
  pvVar8 = malloc((long)(GMRESSteps + 1) << 3);
  if (pvVar8 == (void *)0x0) {
    bVar4 = false;
  }
  __ptr_00 = malloc((long)(GMRESSteps + 2) << 3);
  if (__ptr_00 == (void *)0x0) {
    bVar4 = false;
  }
  __ptr_01 = malloc((long)(GMRESSteps + 1) << 3);
  if (__ptr_01 == (void *)0x0) {
    bVar4 = false;
  }
  __ptr_02 = malloc((long)(GMRESSteps + 1) << 3);
  if (__ptr_02 == (void *)0x0) {
    bVar4 = false;
  }
  Dim_00 = Q_GetDim(A);
  __ptr_03 = malloc((long)(GMRESSteps + 2) * 0x30);
  if (__ptr_03 == (void *)0x0) {
    bVar4 = false;
  }
  else {
    for (k = 1; k <= GMRESSteps + 1; k = k + 1) {
      sprintf((char *)((long)&i + 2),"v[%d]",(long)k % 1000 & 0xffffffff);
      V_Constr((Vector *)((long)__ptr_03 + (long)k * 0x30),(char *)((long)&i + 2),Dim_00,Normal,True
              );
    }
  }
  if (!bVar4) {
    LASError(LASMemAllocErr,"GMRESIter",(char *)0x0,(char *)0x0,(char *)0x0);
  }
  LVar5 = LASResult();
  if (LVar5 != LASOK) {
LAB_001091f0:
    if (__ptr_03 != (void *)0x0) {
      for (k = 1; k <= GMRESSteps + 1; k = k + 1) {
        V_Destr((Vector *)((long)__ptr_03 + (long)k * 0x30));
      }
      free(__ptr_03);
    }
    if (__ptr != (void *)0x0) {
      for (k = 1; k <= GMRESSteps; k = k + 1) {
        if (*(long *)((long)__ptr + (long)k * 8) != 0) {
          free(*(void **)((long)__ptr + (long)k * 8));
        }
      }
      free(__ptr);
    }
    if (pvVar8 != (void *)0x0) {
      free(pvVar8);
    }
    if (__ptr_00 != (void *)0x0) {
      free(__ptr_00);
    }
    if (__ptr_01 != (void *)0x0) {
      free(__ptr_01);
    }
    if (__ptr_02 != (void *)0x0) {
      free(__ptr_02);
    }
    Q_Unlock(A);
    V_Unlock(x);
    V_Unlock(b);
    return x;
  }
  bNorm_00 = l2Norm_V(b);
  j = 0;
  dVar10 = l1Norm_V(x);
  auVar11._8_4_ = (int)(Dim_00 >> 0x20);
  auVar11._0_8_ = Dim_00;
  auVar11._12_4_ = 0x45300000;
  if (ABS(dVar10 / ((auVar11._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)Dim_00) - 4503599627370496.0))) <
      2.2250738585072014e-307) {
    Asgn_VV((Vector *)((long)__ptr_03 + 0x30),b);
  }
  else {
    BVar6 = Q_KerDefined(A);
    if (BVar6 != False) {
      OrthoRightKer_VQ(x,A);
    }
    pVVar9 = Mul_QV(A,x);
    pVVar9 = Sub_VV(b,pVVar9);
    Asgn_VV((Vector *)((long)__ptr_03 + 0x30),pVVar9);
  }
LAB_00108a6e:
  dVar10 = l2Norm_V((Vector *)((long)__ptr_03 + 0x30));
  BVar6 = RTCResult(j,dVar10,bNorm_00,GMRESIterId);
  local_c9 = BVar6 == False && j < MaxIter;
  if (local_c9) {
    if (PrecondProc != (PrecondProcType)0x0) {
      (*PrecondProc)(A,(Vector *)((long)__ptr_03 + 0x30),(Vector *)((long)__ptr_03 + 0x30),
                     (double)vName._2_8_);
    }
    dVar10 = l2Norm_V((Vector *)((long)__ptr_03 + 0x30));
    *(double *)((long)__ptr_00 + 8) = dVar10;
    MulAsgn_VS((Vector *)((long)__ptr_03 + 0x30),1.0 / *(double *)((long)__ptr_00 + 8));
    k = 0;
    do {
      if (PrecondProc == (PrecondProcType)0x0) {
        BVar6 = RTCResult(j,ABS(*(double *)((long)__ptr_00 + (long)(k + 1) * 8)),bNorm_00,
                          GMRESIterId);
        bVar4 = false;
        if (BVar6 == False) goto LAB_00108b95;
      }
      else {
LAB_00108b95:
        bVar4 = false;
        if (k < GMRESSteps) {
          bVar4 = j < MaxIter;
        }
      }
      if (!bVar4) goto LAB_0010906f;
      iVar7 = k + 1;
      j = j + 1;
      if (PrecondProc == (PrecondProcType)0x0) {
        pVVar9 = Mul_QV(A,(Vector *)((long)__ptr_03 + (long)iVar7 * 0x30));
        Asgn_VV((Vector *)((long)__ptr_03 + (long)(k + 2) * 0x30),pVVar9);
      }
      else {
        pVVar9 = Mul_QV(A,(Vector *)((long)__ptr_03 + (long)iVar7 * 0x30));
        (*PrecondProc)(A,(Vector *)((long)__ptr_03 + (long)(k + 2) * 0x30),pVVar9,
                       (double)vName._2_8_);
      }
      for (h1._4_4_ = 1; h1._4_4_ <= iVar7; h1._4_4_ = h1._4_4_ + 1) {
        dVar10 = Mul_VV((Vector *)((long)__ptr_03 + (long)(k + 2) * 0x30),
                        (Vector *)((long)__ptr_03 + (long)h1._4_4_ * 0x30));
        *(double *)(*(long *)((long)__ptr + (long)iVar7 * 8) + (long)h1._4_4_ * 8) = dVar10;
        pVVar9 = Mul_SV(*(double *)(*(long *)((long)__ptr + (long)iVar7 * 8) + (long)h1._4_4_ * 8),
                        (Vector *)((long)__ptr_03 + (long)h1._4_4_ * 0x30));
        SubAsgn_VV((Vector *)((long)__ptr_03 + (long)(k + 2) * 0x30),pVVar9);
      }
      dVar10 = l2Norm_V((Vector *)((long)__ptr_03 + (long)(k + 2) * 0x30));
      *(double *)(*(long *)((long)__ptr + (long)iVar7 * 8) + (long)(k + 2) * 8) = dVar10;
      MulAsgn_VS((Vector *)((long)__ptr_03 + (long)(k + 2) * 0x30),
                 1.0 / *(double *)(*(long *)((long)__ptr + (long)iVar7 * 8) + (long)(k + 2) * 8));
      for (h1._4_4_ = 1; h1._4_4_ < iVar7; h1._4_4_ = h1._4_4_ + 1) {
        dVar10 = *(double *)((long)__ptr_02 + (long)h1._4_4_ * 8);
        dVar1 = *(double *)(*(long *)((long)__ptr + (long)iVar7 * 8) + (long)h1._4_4_ * 8);
        dVar2 = *(double *)((long)__ptr_01 + (long)h1._4_4_ * 8);
        dVar3 = *(double *)(*(long *)((long)__ptr + (long)iVar7 * 8) + (long)(h1._4_4_ + 1) * 8);
        *(double *)(*(long *)((long)__ptr + (long)iVar7 * 8) + (long)h1._4_4_ * 8) =
             *(double *)((long)__ptr_01 + (long)h1._4_4_ * 8) *
             *(double *)(*(long *)((long)__ptr + (long)iVar7 * 8) + (long)h1._4_4_ * 8) +
             *(double *)((long)__ptr_02 + (long)h1._4_4_ * 8) *
             *(double *)(*(long *)((long)__ptr + (long)iVar7 * 8) + (long)(h1._4_4_ + 1) * 8);
        *(double *)(*(long *)((long)__ptr + (long)iVar7 * 8) + (long)(h1._4_4_ + 1) * 8) =
             -dVar10 * dVar1 + dVar2 * dVar3;
      }
      dVar10 = sqrt(*(double *)(*(long *)((long)__ptr + (long)iVar7 * 8) + (long)iVar7 * 8) *
                    *(double *)(*(long *)((long)__ptr + (long)iVar7 * 8) + (long)iVar7 * 8) +
                    *(double *)(*(long *)((long)__ptr + (long)iVar7 * 8) + (long)(k + 2) * 8) *
                    *(double *)(*(long *)((long)__ptr + (long)iVar7 * 8) + (long)(k + 2) * 8));
      *(double *)((long)__ptr_01 + (long)iVar7 * 8) =
           *(double *)(*(long *)((long)__ptr + (long)iVar7 * 8) + (long)iVar7 * 8) / dVar10;
      *(double *)((long)__ptr_02 + (long)iVar7 * 8) =
           *(double *)(*(long *)((long)__ptr + (long)iVar7 * 8) + (long)(k + 2) * 8) / dVar10;
      *(double *)(*(long *)((long)__ptr + (long)iVar7 * 8) + (long)iVar7 * 8) = dVar10;
      *(undefined8 *)(*(long *)((long)__ptr + (long)iVar7 * 8) + (long)(k + 2) * 8) = 0;
      *(double *)((long)__ptr_00 + (long)(k + 2) * 8) =
           -*(double *)((long)__ptr_02 + (long)iVar7 * 8) *
           *(double *)((long)__ptr_00 + (long)iVar7 * 8);
      *(double *)((long)__ptr_00 + (long)iVar7 * 8) =
           *(double *)((long)__ptr_01 + (long)iVar7 * 8) *
           *(double *)((long)__ptr_00 + (long)iVar7 * 8);
      k = iVar7;
    } while( true );
  }
  goto LAB_001091f0;
LAB_0010906f:
  for (local_50 = k; 0 < local_50; local_50 = local_50 + -1) {
    *(double *)((long)pvVar8 + (long)local_50 * 8) =
         *(double *)((long)__ptr_00 + (long)local_50 * 8) /
         *(double *)(*(long *)((long)__ptr + (long)local_50 * 8) + (long)local_50 * 8);
    h1._4_4_ = local_50;
    while (h1._4_4_ = h1._4_4_ + -1, 0 < h1._4_4_) {
      *(double *)((long)__ptr_00 + (long)h1._4_4_ * 8) =
           -*(double *)(*(long *)((long)__ptr + (long)local_50 * 8) + (long)h1._4_4_ * 8) *
           *(double *)((long)pvVar8 + (long)local_50 * 8) +
           *(double *)((long)__ptr_00 + (long)h1._4_4_ * 8);
    }
  }
  for (local_50 = k; 0 < local_50; local_50 = local_50 + -1) {
    pVVar9 = Mul_SV(*(double *)((long)pvVar8 + (long)local_50 * 8),
                    (Vector *)((long)__ptr_03 + (long)local_50 * 0x30));
    AddAsgn_VV(x,pVVar9);
  }
  BVar6 = Q_KerDefined(A);
  if (BVar6 != False) {
    OrthoRightKer_VQ(x,A);
  }
  pVVar9 = Mul_QV(A,x);
  pVVar9 = Sub_VV(b,pVVar9);
  Asgn_VV((Vector *)((long)__ptr_03 + 0x30),pVVar9);
  goto LAB_00108a6e;
}

Assistant:

Vector *GMRESIter(QMatrix *A, Vector *x, Vector *b, int MaxIter,
            PrecondProcType PrecondProc, double OmegaPrecond)
{
    /*
     *  for details to the algorithm see
     *
     *  R. Barrett, M. Berry, T. F. Chan, J. Demmel, J. Donato, J. Dongarra,
     *  V. Eijkhout, R. Pozo, Ch. Romine, H. van der Vorst:
     *  Templates for the Solution of Linear Systems: Building Blocks
     *  for Iterative Solvers;
     *  SIAM, Philadelphia, 1994
     *
     */

    char vName[10];
    int Iter, i, j, k;
    double h1, h2, r;
    double bNorm;
    double **h, *y, *s, *c1, *c2;
    size_t Dim;
    Boolean AllocOK;
    Vector *v;

    Q_Lock(A);
    V_Lock(x);
    V_Lock(b);
    
    /* allocation of matrix H and vectors y, s, c1 and c2 */
    AllocOK = True;
    h = (double **)malloc((GMRESSteps + 1) * sizeof(double *));
    if (h == NULL) {
        AllocOK = False;
    } else {
        for (i = 1; i <= GMRESSteps; i++) {
            h[i] = (double *)malloc((GMRESSteps + 2) * sizeof(double));
            if (h[i] == NULL)
                AllocOK = False;
	}
    }
    y = (double *)malloc((GMRESSteps + 1) * sizeof(double));
    if (y == NULL)
        AllocOK = False;
    s = (double *)malloc((GMRESSteps + 2) * sizeof(double));
    if (s == NULL)
        AllocOK = False;
    c1 = (double *)malloc((GMRESSteps + 1) * sizeof(double));
    if (c1 == NULL)
        AllocOK = False;
    c2 = (double *)malloc((GMRESSteps + 1) * sizeof(double));
    if (c2 == NULL)
        AllocOK = False;

    /* ... and vectors u */    
    Dim = Q_GetDim(A);
    v = (Vector *)malloc((GMRESSteps + 2) * sizeof(Vector));
    if (v == NULL)
        AllocOK = False;
    else
        for (i = 1; i <= GMRESSteps + 1; i++) {
	    sprintf(vName, "v[%d]", i % 1000);
            V_Constr(&v[i], vName, Dim, Normal, True);
	}

    if (!AllocOK)
        LASError(LASMemAllocErr, "GMRESIter", NULL, NULL, NULL);
        
    if (LASResult() == LASOK) {
        bNorm = l2Norm_V(b);

        /* loop for 'MaxIter' GMRES cycles */
        Iter = 0;
        /* v[1] = r = b - A * x(i) */
        if (!IsZero(l1Norm_V(x) / Dim)) {
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            Asgn_VV(&v[1], Sub_VV(b, Mul_QV(A, x)));
        } else {
            Asgn_VV(&v[1], b);
	}
        while (!RTCResult(Iter, l2Norm_V(&v[1]), bNorm, GMRESIterId)
            && Iter < MaxIter) {
            if (PrecondProc != NULL)
	        (*PrecondProc)(A, &v[1], &v[1], OmegaPrecond);
            s[1] = l2Norm_V(&v[1]);
            MulAsgn_VS(&v[1], 1.0 / s[1]);

            /* GMRES iteration */
            i = 0;
            while ((PrecondProc != NULL ? True : !RTCResult(Iter, fabs(s[i+1]),
                bNorm, GMRESIterId)) && i < GMRESSteps && Iter < MaxIter) {
 	        i++;
		Iter++;
                /* w = v[i+1] */
                if (PrecondProc != NULL) 
		    (*PrecondProc)(A, &v[i+1], Mul_QV(A, &v[i]), OmegaPrecond);
                else
                    Asgn_VV(&v[i+1], Mul_QV(A, &v[i]));

                /* modified Gram-Schmidt orthogonalization */
                for (k = 1; k <= i; k++) {
                    h[i][k] = Mul_VV(&v[i+1], &v[k]);
                    SubAsgn_VV(&v[i+1], Mul_SV(h[i][k], &v[k]));
                }

                h[i][i+1] = l2Norm_V(&v[i+1]);
                MulAsgn_VS(&v[i+1], 1.0 / h[i][i+1]);

                /* Q-R algorithm */
                for (k = 1; k < i; k++) {
                    h1 = c1[k] * h[i][k] + c2[k] * h[i][k+1];
                    h2 = - c2[k] * h[i][k] + c1[k] * h[i][k+1];
                    h[i][k] = h1;
                    h[i][k+1] = h2;
                }
                r = sqrt(h[i][i] * h[i][i] + h[i][i+1] * h[i][i+1]);
                c1[i] = h[i][i] / r;
                c2[i] = h[i][i+1] / r;
                h[i][i] = r;
                h[i][i+1] = 0.0;
                s[i+1] = - c2[i] * s[i];
                s[i] = c1[i] * s[i];
            }

            /* Solving of the system of equations : H y = s */
            for (j = i; j > 0; j--) {
                y[j] = s[j] / h[j][j];
                for (k = j - 1; k > 0; k--)
                    s[k] -= h[j][k] * y[j];
            }

            /* updating solution */
            for (j = i; j > 0; j--)
                AddAsgn_VV(x, Mul_SV(y[j], &v[j]));
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
                
            /* computing new residual */
            Asgn_VV(&v[1], Sub_VV(b, Mul_QV(A, x)));
        }
    }

    /* release of vectors u, matrix H and vectors y, s, c1 and c2 */
    if (v != NULL) {
        for (i = 1; i <= GMRESSteps + 1; i++)
            V_Destr(&v[i]);
        free(v);
    }

    if (h != NULL) {
        for (i = 1; i <= GMRESSteps; i++)
	    if (h[i] != NULL)
                free(h[i]);
        free(h);
    }
    if (y != NULL)
        free(y);
    if (s != NULL)
        free(s);
    if (c1 != NULL)
        free(c1);
    if (c2 != NULL)
        free(c2);

    Q_Unlock(A);
    V_Unlock(x);
    V_Unlock(b);

    return(x);
}